

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O0

Channel * __thiscall sznet::net::Channel::eventsToString_abi_cxx11_(Channel *this,sz_sock fd,int ev)

{
  ostream *poVar1;
  ostringstream local_190 [8];
  ostringstream oss;
  int ev_local;
  sz_sock fd_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,fd);
  std::operator<<(poVar1,": ");
  if ((ev & 1U) != 0) {
    std::operator<<((ostream *)local_190,"IN ");
  }
  if ((ev & 2U) != 0) {
    std::operator<<((ostream *)local_190,"PRI ");
  }
  if ((ev & 4U) != 0) {
    std::operator<<((ostream *)local_190,"RDHUP ");
  }
  if ((ev & 8U) != 0) {
    std::operator<<((ostream *)local_190,"OUT ");
  }
  if ((ev & 0x10U) != 0) {
    std::operator<<((ostream *)local_190,"ERROR ");
  }
  if ((ev & 0x20U) != 0) {
    std::operator<<((ostream *)local_190,"HUP ");
  }
  if ((ev & 0x40U) != 0) {
    std::operator<<((ostream *)local_190,"NVAL ");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

string Channel::eventsToString(sockets::sz_sock fd, int ev)
{
	std::ostringstream oss;
	oss << fd << ": ";
	if (ev & kReadEvent)
	{
		oss << "IN ";
	}
	if (ev & kPriEvent)
	{
		oss << "PRI ";
	}
	if (ev & kRdHupEvent)
	{
		oss << "RDHUP ";
	}
	if (ev & kWriteEvent)
	{
		oss << "OUT ";
	}
	if (ev & kErrorEvent)
	{
		oss << "ERROR ";
	}
	if (ev & kHupEvent)
	{
		oss << "HUP ";
	}
	if (ev & kNvalEvent)
	{
		oss << "NVAL ";
	}
	return oss.str();
}